

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestream.cc
# Opt level: O3

void __thiscall
google::protobuf::strings::CheckedArrayByteSink::Append
          (CheckedArrayByteSink *this,char *bytes,size_t n)

{
  ulong uVar1;
  LogMessage *pLVar2;
  char *pcVar3;
  size_t sVar4;
  LogMessage local_68;
  LogFinisher local_29;
  
  sVar4 = this->size_;
  uVar1 = this->capacity_ - sVar4;
  if (uVar1 < n) {
    this->overflowed_ = true;
    n = uVar1;
  }
  if ((n != 0) && (pcVar3 = this->outbuf_, pcVar3 + sVar4 != bytes)) {
    if (bytes < pcVar3 + this->capacity_ && pcVar3 <= bytes) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/stubs/bytestream.cc"
                 ,0x50);
      pLVar2 = internal::LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: !(outbuf_ <= bytes && bytes < (outbuf_ + capacity_)): ");
      pLVar2 = internal::LogMessage::operator<<(pLVar2,"Append() bytes[] overlaps with outbuf_[]");
      internal::LogFinisher::operator=(&local_29,pLVar2);
      internal::LogMessage::~LogMessage(&local_68);
      pcVar3 = this->outbuf_;
      sVar4 = this->size_;
    }
    memcpy(pcVar3 + sVar4,bytes,n);
    sVar4 = this->size_;
  }
  this->size_ = sVar4 + n;
  return;
}

Assistant:

void CheckedArrayByteSink::Append(const char* bytes, size_t n) {
  size_t available = capacity_ - size_;
  if (n > available) {
    n = available;
    overflowed_ = true;
  }
  if (n > 0 && bytes != (outbuf_ + size_)) {
    // Catch cases where the pointer returned by GetAppendBuffer() was modified.
    GOOGLE_DCHECK(!(outbuf_ <= bytes && bytes < (outbuf_ + capacity_)))
        << "Append() bytes[] overlaps with outbuf_[]";
    memcpy(outbuf_ + size_, bytes, n);
  }
  size_ += n;
}